

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O0

void __thiscall SCSI::Bus::Bus(Bus *this,HalfCycles clock_rate)

{
  double dVar1;
  IntType IVar2;
  reference pvVar3;
  Bus *this_local;
  HalfCycles clock_rate_local;
  
  this_local = (Bus *)clock_rate.super_WrappedInt<HalfCycles>.length_;
  ClockingHint::Source::Source(&this->super_Source);
  Activity::Source::Source(&this->super_Source);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_00caaef8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00caaf18;
  HalfCycles::HalfCycles(&this->time_in_state_);
  this->cycles_to_time_ = 1.0;
  this->dispatch_index_ = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->device_states_);
  this->state_ = 0;
  std::vector<SCSI::Bus::Observer_*,_std::allocator<SCSI::Bus::Observer_*>_>::vector
            (&this->observers_);
  this->activity_observer_ = (Observer *)0x0;
  IVar2 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
  this->cycles_to_time_ = 1.0 / (double)IVar2;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,0);
  *pvVar3 = (long)(1e-08 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,1);
  *pvVar3 = (long)(4.5e-08 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,2);
  *pvVar3 = (long)(1e-07 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,3);
  *pvVar3 = (long)(4.5e-07 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,4);
  *pvVar3 = (long)(6.5e-07 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,5);
  *pvVar3 = (long)(1.1e-06 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,6);
  *pvVar3 = (long)(1.7e-06 / dVar1) + 1;
  dVar1 = this->cycles_to_time_;
  pvVar3 = std::array<long,_8UL>::operator[](&this->dispatch_times_,7);
  *pvVar3 = (long)(2.5e-05 / dVar1) + 1;
  return;
}

Assistant:

Bus::Bus(HalfCycles clock_rate) {
	cycles_to_time_ = 1.0 / double(clock_rate.as_integral());

	// NB: note that the dispatch times below are **ORDERED**
	// from least to greatest. Each box should contain the number
	// of whole clock periods it will take to get the the first
	// discrete moment after the required delay interval has been met.
	using IntType = Cycles::IntType;
	dispatch_times_[0] = 1 + IntType(CableSkew / cycles_to_time_);
	dispatch_times_[1] = 1 + IntType(DeskewDelay / cycles_to_time_);
	dispatch_times_[2] = 1 + IntType(BusFreeDelay / cycles_to_time_);
	dispatch_times_[3] = 1 + IntType(BusSettleDelay / cycles_to_time_);
	dispatch_times_[4] = 1 + IntType(BusClearDelay / cycles_to_time_);
	dispatch_times_[5] = 1 + IntType(BusSetDelay / cycles_to_time_);
	dispatch_times_[6] = 1 + IntType(ArbitrationDelay / cycles_to_time_);
	dispatch_times_[7] = 1 + IntType(ResetHoldTime / cycles_to_time_);
}